

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetatype.h
# Opt level: O3

int qRegisterMetaType<QNetworkInterface>(char *typeName)

{
  int iVar1;
  long in_FS_OFFSET;
  QByteArray local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_38.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_38.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_38.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
  QMetaObject::normalizedType((char *)&local_38);
  iVar1 = qRegisterNormalizedMetaTypeImplementation<QNetworkInterface>(&local_38);
  if (&(local_38.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_38.d.d)->super_QArrayData,1,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return iVar1;
  }
  __stack_chk_fail();
}

Assistant:

int qRegisterMetaType(const char *typeName)
{
#ifdef QT_NO_QOBJECT
    QT_PREPEND_NAMESPACE(QByteArray) normalizedTypeName = typeName;
#else
    QT_PREPEND_NAMESPACE(QByteArray) normalizedTypeName = QMetaObject::normalizedType(typeName);
#endif
    return qRegisterNormalizedMetaType<T>(normalizedTypeName);
}